

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pySRUP.cpp
# Opt level: O0

object get_token(SRUP_MSG *self)

{
  uint16_t uVar1;
  uint8_t *puVar2;
  SRUP_MSG *in_RSI;
  allocator local_41;
  string local_40 [32];
  uint8_t *local_20;
  uint8_t *rv;
  SRUP_MSG *self_local;
  
  rv = (uint8_t *)in_RSI;
  self_local = self;
  puVar2 = SRUP_MSG::token(in_RSI);
  local_20 = puVar2;
  if (puVar2 == (uint8_t *)0x0) {
    boost::python::api::object::object((object *)self);
  }
  else {
    uVar1 = SRUP_MSG::token_length((SRUP_MSG *)rv);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,(char *)puVar2,(ulong)uVar1,&local_41);
    boost::python::api::object::object<std::__cxx11::string>
              ((object *)self,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return (object)(object_base)self;
}

Assistant:

boost::python::object get_token(SRUP_MSG& self)
{
    const uint8_t* rv;
    rv = self.token();
    if (rv!=nullptr)
        return boost::python::object(std::string((char*)rv, self.token_length()));
    else
        return boost::python::object();
}